

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shanten.cpp
# Opt level: O1

int mahjong::basic_form_shanten_specified
              (tile_table_t *cnt_table,tile_t *main_tiles,int main_cnt,intptr_t fixed_cnt,
              useful_table_t *useful_table)

{
  int i;
  int iVar1;
  long lVar2;
  undefined4 in_register_00000014;
  int iVar3;
  tile_table_t temp_table;
  uint16_t auStack_b8 [72];
  
  memcpy(auStack_b8,cnt_table,0x90);
  lVar2 = 0;
  iVar3 = 0;
  do {
    if ((*cnt_table)[main_tiles[lVar2]] != 0) {
      iVar3 = iVar3 + 1;
      auStack_b8[main_tiles[lVar2]] = auStack_b8[main_tiles[lVar2]] - 1;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 9);
  if (fixed_cnt != 0) {
    *(undefined8 *)(fixed_cnt + 0x30) = 0;
    *(undefined8 *)(fixed_cnt + 0x38) = 0;
    *(undefined8 *)(fixed_cnt + 0x20) = 0;
    *(undefined8 *)(fixed_cnt + 0x28) = 0;
    *(undefined8 *)(fixed_cnt + 0x10) = 0;
    *(undefined8 *)(fixed_cnt + 0x18) = 0;
    *(undefined8 *)fixed_cnt = 0;
    *(undefined8 *)(fixed_cnt + 8) = 0;
    *(undefined8 *)(fixed_cnt + 0x40) = 0;
    lVar2 = 0;
    do {
      if ((*cnt_table)[main_tiles[lVar2]] == 0) {
        *(undefined1 *)(fixed_cnt + (ulong)main_tiles[lVar2]) = 1;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 9);
  }
  iVar1 = basic_form_shanten_from_table
                    (&auStack_b8,CONCAT44(in_register_00000014,main_cnt) + 3,
                     (useful_table_t *)fixed_cnt);
  return (iVar1 - iVar3) + 9;
}

Assistant:

static int basic_form_shanten_specified(const tile_table_t &cnt_table, const tile_t *main_tiles, int main_cnt,
    intptr_t fixed_cnt, useful_table_t *useful_table) {

    tile_table_t temp_table;
    memcpy(&temp_table, &cnt_table, sizeof(temp_table));
    int exist_cnt = 0;

    // 统计主番的牌
    for (int i = 0; i < main_cnt; ++i) {
        tile_t t = main_tiles[i];
        int n = cnt_table[t];
        if (n > 0) {  // 有，削减之
            ++exist_cnt;
            --temp_table[t];
        }
    }

    // 记录有效牌
    if (useful_table != nullptr) {
        memset(*useful_table, 0, sizeof(*useful_table));

        // 统计主番缺失的牌
        for (int i = 0; i < main_cnt; ++i) {
            tile_t t = main_tiles[i];
            int n = cnt_table[t];
            if (n <= 0) {
                (*useful_table)[t] = true;
            }
        }
    }

    // 余下牌的上听数
    int result = basic_form_shanten_from_table(temp_table, fixed_cnt + main_cnt / 3, useful_table);

    // 上听数=主番缺少的张数+余下牌的上听数
    return (main_cnt - exist_cnt) + result;
}